

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

void rpn_BankSymbol(Expression *expr,char *symName)

{
  bool bVar1;
  int iVar2;
  Symbol *pSVar3;
  Section *pSVar4;
  char *pcVar5;
  int *piVar6;
  size_t sVar7;
  uint8_t *puVar8;
  uint8_t *ptr;
  size_t nameLen;
  int size;
  Expression *_expr;
  Symbol *sym;
  char *symName_local;
  Expression *expr_local;
  
  pSVar3 = sym_FindScopedSymbol(symName);
  bVar1 = sym_IsPC(pSVar3);
  if (bVar1) {
    rpn_BankSelf(expr);
  }
  else {
    rpn_Init(expr);
    if ((pSVar3 == (Symbol *)0x0) || (bVar1 = sym_IsLabel(pSVar3), bVar1)) {
      pSVar3 = sym_Ref(symName);
      if (pSVar3 == (Symbol *)0x0) {
        __assert_fail("sym",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/rpn.cpp"
                      ,0x99,"rpn_BankSymbol");
      }
      pSVar4 = sym_GetSection(pSVar3);
      if ((pSVar4 == (Section *)0x0) ||
         (pSVar4 = sym_GetSection(pSVar3), pSVar4->bank == 0xffffffff)) {
        expr->isKnown = false;
        pcVar5 = (char *)malloc(0x80);
        expr->reason = pcVar5;
        if (expr->reason == (char *)0x0) {
          piVar6 = __errno_location();
          pcVar5 = strerror(*piVar6);
          fatalerror("Can\'t allocate err string: %s\n",pcVar5);
        }
        iVar2 = snprintf(expr->reason,0x80,"\"%s\"\'s bank is not known",symName);
        if (0x7f < iVar2) {
          pcVar5 = (char *)realloc(expr->reason,(long)(iVar2 + 1));
          expr->reason = pcVar5;
          if (expr->reason == (char *)0x0) {
            piVar6 = __errno_location();
            pcVar5 = strerror(*piVar6);
            fatalerror("Can\'t allocate err string: %s\n",pcVar5);
          }
          sprintf(expr->reason,"\"%s\"\'s bank is not known",symName);
        }
        expr->rpnPatchSize = expr->rpnPatchSize + 5;
        sVar7 = strlen(pSVar3->name);
        puVar8 = reserveSpace(expr,(int)(sVar7 + 1) + 1);
        *puVar8 = 'P';
        memcpy(puVar8 + 1,pSVar3,sVar7 + 1);
      }
      else {
        pSVar4 = sym_GetSection(pSVar3);
        expr->val = pSVar4->bank;
      }
    }
    else {
      error("BANK argument must be a label\n");
    }
  }
  return;
}

Assistant:

void rpn_BankSymbol(struct Expression *expr, char const *symName)
{
	struct Symbol const *sym = sym_FindScopedSymbol(symName);

	// The @ symbol is treated differently.
	if (sym_IsPC(sym)) {
		rpn_BankSelf(expr);
		return;
	}

	rpn_Init(expr);
	if (sym && !sym_IsLabel(sym)) {
		error("BANK argument must be a label\n");
	} else {
		sym = sym_Ref(symName);
		assert(sym); // If the symbol didn't exist, it should have been created

		if (sym_GetSection(sym) && sym_GetSection(sym)->bank != (uint32_t)-1) {
			// Symbol's section is known and bank is fixed
			expr->val = sym_GetSection(sym)->bank;
		} else {
			makeUnknown(expr, "\"%s\"'s bank is not known", symName);
			expr->rpnPatchSize += 5; // opcode + 4-byte sect ID

			size_t nameLen = strlen(sym->name) + 1; // Room for NUL!
			uint8_t *ptr = reserveSpace(expr, nameLen + 1);
			*ptr++ = RPN_BANK_SYM;
			memcpy(ptr, sym->name, nameLen);
		}
	}
}